

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipdir.c
# Opt level: O3

void free_dir_tree(dir_tree_t *tree)

{
  file_entry_s *pfVar1;
  file_entry_t *__ptr;
  
  if (tree == (dir_tree_t *)0x0) {
    return;
  }
  __ptr = tree->files;
  while (__ptr != (file_entry_t *)0x0) {
    pfVar1 = __ptr->next;
    free(__ptr);
    __ptr = pfVar1;
  }
  free(tree);
  return;
}

Assistant:

void free_dir_tree(dir_tree_t *tree)
{
	file_entry_t *entry, *next;

	if (tree != NULL)
	{
		for (entry = tree->files; entry != NULL; entry = next)
		{
			next = entry->next;
			free(entry);
		}
		free(tree);
	}
}